

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O3

String __thiscall Bstrlib::String::normalizedPath(String *this,char sep,bool includeLastSep)

{
  byte *pbVar1;
  char in_CL;
  undefined7 in_register_00000011;
  uchar *extraout_RDX;
  undefined7 in_register_00000031;
  long lVar3;
  ulong uVar4;
  String SVar5;
  String SStack_28;
  uchar *puVar2;
  
  lVar3 = CONCAT71(in_register_00000031,sep);
  uVar4 = (ulong)*(uint *)(lVar3 + 4);
  do {
    if ((int)uVar4 < 1) goto LAB_0011206a;
    pbVar1 = (byte *)(*(long *)(lVar3 + 8) + -1 + uVar4);
    uVar4 = uVar4 - 1;
  } while ((uint)*pbVar1 == (uint)CONCAT71(in_register_00000011,includeLastSep));
  if (in_CL == '\0') {
    SVar5 = midString(this,(int)lVar3,0);
    puVar2 = SVar5.super_tagbstring.data;
  }
  else {
LAB_0011206a:
    midString(&SStack_28,(int)lVar3,0);
    SVar5 = operator+(this,(char)&SStack_28);
    puVar2 = SVar5.super_tagbstring.data;
    if (SStack_28.super_tagbstring.data != (uchar *)0x0) {
      free(SStack_28.super_tagbstring.data);
      puVar2 = extraout_RDX;
    }
  }
  SVar5.super_tagbstring.data = puVar2;
  SVar5.super_tagbstring._0_8_ = this;
  return (String)SVar5.super_tagbstring;
}

Assistant:

String String::normalizedPath(char sep, const bool includeLastSep) const
    {
        int rightLimit = slen - 1;
        while (rightLimit >= 0 && data[rightLimit] == sep) rightLimit--;
        return includeLastSep || rightLimit < 0 ? midString(0, rightLimit+1) + sep : midString(0, rightLimit+1);
    }